

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O0

int luaZ_fill(ZIO *z)

{
  byte *pbVar1;
  char *pcVar2;
  char *buff;
  lua_State *L;
  size_t size;
  ZIO *z_local;
  
  size = (size_t)z;
  pcVar2 = (*z->reader)(z->L,z->data,(size_t *)&L);
  if ((pcVar2 == (char *)0x0) || (L == (lua_State *)0x0)) {
    z_local._4_4_ = 0xffffffff;
  }
  else {
    *(undefined1 **)size = &L[-1].field_0xcf;
    *(char **)(size + 8) = pcVar2;
    pbVar1 = *(byte **)(size + 8);
    *(byte **)(size + 8) = pbVar1 + 1;
    z_local._4_4_ = (uint)*pbVar1;
  }
  return z_local._4_4_;
}

Assistant:

int luaZ_fill (ZIO *z) {
  size_t size;
  lua_State *L = z->L;
  const char *buff;
  lua_unlock(L);
  buff = z->reader(L, z->data, &size);
  lua_lock(L);
  if (buff == NULL || size == 0)
    return EOZ;
  z->n = size - 1;  /* discount char being returned */
  z->p = buff;
  return cast_uchar(*(z->p++));
}